

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O3

char * BinarySource_get_asciz(BinarySource *src)

{
  size_t sVar1;
  void *pvVar2;
  char *pcVar3;
  char *__s;
  
  pcVar3 = "";
  if (src->err == BSE_NO_ERROR) {
    sVar1 = src->pos;
    __s = (char *)((long)src->data + sVar1);
    pvVar2 = memchr(__s,0,src->len - sVar1);
    if (pvVar2 == (void *)0x0) {
      src->err = BSE_OUT_OF_DATA;
    }
    else {
      src->pos = (long)pvVar2 + (sVar1 - (long)__s) + 1;
      pcVar3 = __s;
    }
  }
  return pcVar3;
}

Assistant:

const char *BinarySource_get_asciz(BinarySource *src)
{
    const char *start, *end;

    if (src->err)
        return "";

    start = here;
    end = memchr(start, '\0', src->len - src->pos);
    if (!end) {
        src->err = BSE_OUT_OF_DATA;
        return "";
    }

    advance(end + 1 - start);
    return start;
}